

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

bool_t ecpToAJ(word *b,word *a,ec_o *ec,void *stack)

{
  word *pwVar1;
  word *pwVar2;
  size_t n;
  bool_t bVar3;
  word *pwVar4;
  
  n = ec->f->n;
  pwVar1 = a + n;
  bVar3 = wwIsZero(pwVar1 + n,n);
  if (bVar3 == 0) {
    pwVar4 = (word *)(n * 8 + (long)stack);
    pwVar2 = pwVar4 + n;
    (*ec->f->inv)((word *)stack,pwVar1 + n,ec->f,pwVar2);
    (*ec->f->sqr)(pwVar4,(word *)stack,ec->f,pwVar2);
    (*ec->f->mul)(b,a,pwVar4,ec->f,pwVar2);
    (*ec->f->mul)(pwVar4,(word *)stack,pwVar4,ec->f,pwVar2);
    (*ec->f->mul)(b + n,pwVar1,pwVar4,ec->f,pwVar2);
  }
  return (uint)(bVar3 == 0);
}

Assistant:

static bool_t ecpToAJ(word b[], const word a[], const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	stack = t2 + n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ecpSeemsOn3(a, ec));
	ASSERT(a == b || wwIsDisjoint2(a, 3 * n, b, 2 * n));
	// a == O => b <- O
	if (qrIsZero(ecZ(a, n), ec->f))
		return FALSE;
	// t1 <- za^{-1}
	qrInv(t1, ecZ(a, n), ec->f, stack);
	// t2 <- t1^2
	qrSqr(t2, t1, ec->f, stack);
	// xb <- xa t2
	qrMul(ecX(b), ecX(a), t2, ec->f, stack);
	// t2 <- t1 t2
	qrMul(t2, t1, t2, ec->f, stack);
	// yb <- ya t2
	qrMul(ecY(b, n), ecY(a, n), t2, ec->f, stack);
	// b != O
	return TRUE;
}